

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

FName __thiscall AActor::GetSpecies(AActor *this)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  undefined8 *in_RSI;
  
  iVar3 = *(int *)((long)in_RSI + 0x23c);
  if (iVar3 == 0) {
    lVar4 = in_RSI[1];
    if (lVar4 == 0) {
      lVar4 = (**(code **)*in_RSI)();
      in_RSI[1] = lVar4;
    }
    bVar1 = *(byte *)(*(long *)(lVar4 + 200) + 0x195);
    lVar5 = lVar4;
    while ((lVar2 = lVar4, (bVar1 & 0x20) != 0 &&
           (lVar4 = *(long *)(lVar2 + 0xb0), lVar5 = lVar2, lVar4 != 0))) {
      bVar1 = *(byte *)(*(long *)(lVar4 + 200) + 0x195);
    }
    iVar3 = *(int *)(lVar5 + 0x88);
    *(int *)((long)in_RSI + 0x23c) = iVar3;
  }
  *(int *)&(this->super_DThinker).super_DObject._vptr_DObject = iVar3;
  return (FName)(int)this;
}

Assistant:

FName AActor::GetSpecies()
{
	if (Species != NAME_None)
	{
		return Species;
	}

	PClassActor *thistype = GetClass();

	if (GetDefaultByType(thistype)->flags3 & MF3_ISMONSTER)
	{
		while (thistype->ParentClass)
		{
			if (GetDefaultByType(thistype->ParentClass)->flags3 & MF3_ISMONSTER)
				thistype = static_cast<PClassActor *>(thistype->ParentClass);
			else 
				break;
		}
	}
	return Species = thistype->TypeName; // [GZ] Speeds up future calls.
}